

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

int8_t __thiscall
icu_63::UnicodeString::compare(UnicodeString *this,ConstChar16Ptr *srcChars,int32_t srcLength)

{
  int8_t iVar1;
  int32_t length;
  char16_t *srcChars_00;
  int32_t srcLength_local;
  ConstChar16Ptr *srcChars_local;
  UnicodeString *this_local;
  
  length = UnicodeString::length(this);
  srcChars_00 = ConstChar16Ptr::operator_cast_to_char16_t_(srcChars);
  iVar1 = doCompare(this,0,length,srcChars_00,0,srcLength);
  return iVar1;
}

Assistant:

inline int8_t
UnicodeString::compare(ConstChar16Ptr srcChars,
               int32_t srcLength) const
{ return doCompare(0, length(), srcChars, 0, srcLength); }